

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O0

Variable __thiscall LiteScript::Memory::Create(Memory *this,Type *type)

{
  bool bVar1;
  reference ppvVar2;
  _BasicMemory_1 *this_00;
  reference pvVar3;
  uint in_EDX;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *puVar4;
  Variable VVar5;
  Type *type_local;
  Memory *this_local;
  Variable *result;
  
  ppvVar2 = std::array<void_*,_256UL>::operator[]
                      ((array<void_*,_256UL> *)type,(long)*(short *)&type[0x35].name);
  if (*ppvVar2 == (value_type)0x0) {
    this_00 = (_BasicMemory_1 *)operator_new(0xa18);
    _BasicMemory_1::_BasicMemory_1(this_00,(Memory *)type);
    ppvVar2 = std::array<void_*,_256UL>::operator[]
                        ((array<void_*,_256UL> *)type,(long)*(short *)&type[0x35].name);
    *ppvVar2 = this_00;
  }
  ppvVar2 = std::array<void_*,_256UL>::operator[]
                      ((array<void_*,_256UL> *)type,(long)*(short *)&type[0x35].name);
  _BasicMemory_1::Create((_BasicMemory_1 *)this,(Type *)*ppvVar2,in_EDX);
  ppvVar2 = std::array<void_*,_256UL>::operator[]
                      ((array<void_*,_256UL> *)type,(long)*(short *)&type[0x35].name);
  bVar1 = _BasicMemory_1::isFull((_BasicMemory_1 *)*ppvVar2);
  puVar4 = extraout_RDX;
  if (bVar1) {
    pvVar3 = std::array<short,_256UL>::operator[]
                       ((array<short,_256UL> *)&type[0x2a].field_0x20,
                        (long)*(short *)&type[0x35].name);
    *(value_type_conflict1 *)&type[0x35].name = *pvVar3;
    puVar4 = extraout_RDX_00;
  }
  *(int *)&type[0x35].field_0x14 = *(int *)&type[0x35].field_0x14 + 1;
  VVar5.nb_ref = puVar4;
  VVar5.obj = (Object *)this;
  return VVar5;
}

Assistant:

LiteScript::Variable LiteScript::Memory::Create(Type &type) {
    // Si le premier non plein n'existe pas, on le crée
    if (this->arr[this->first_nfull] == nullptr)
        this->arr[this->first_nfull] = (void *)(new LiteScript::_BasicMemory_1(*this));
    // On crée l'objet
    Variable result = ((LiteScript::_BasicMemory_1 *)(this->arr[this->first_nfull]))->Create(type, ((unsigned int)this->first_nfull) << 16);
    // Si le premier non plein devient plein, on passe au suivant
    if (((LiteScript::_BasicMemory_1 *)(this->arr[this->first_nfull]))->isFull())
        this->first_nfull = this->nfull[this->first_nfull];
    // On incrémente le compteur d'objets
    this->count++;
    // On retourne la variable
    return result;
}